

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

void __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::reportSubtree(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,Node *node,vector<int_*,_std::allocator<int_*>_> *result)

{
  for (; node->left != (Node *)0x0; node = node->right) {
    reportSubtree(this,node->left,result);
  }
  std::vector<int_*,_std::allocator<int_*>_>::push_back(result,&node->value);
  return;
}

Assistant:

void reportSubtree(const Node * const node, std::vector<T*> * const result) const {
			if (node->left != 0) {
				reportSubtree(node->left, result);
				reportSubtree(node->right, result);
			}
			else {
				result->push_back(node->value);
			}
		}